

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O3

void __thiscall deci::array_t::~array_t(array_t *this)

{
  ~array_t(this);
  operator_delete(this);
  return;
}

Assistant:

array_t::~array_t() {
      for (auto el: this->elements) {
        el->Delete();
      }
    }